

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_P2wpkhAddressTest_Test::~Address_P2wpkhAddressTest_Test
          (Address_P2wpkhAddressTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, P2wpkhAddressTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kMainnet,
                   WitnessVersion::kVersion0, pubkey)));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
               address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kTestnet,
                   WitnessVersion::kVersion0, pubkey)));
  EXPECT_STREQ("tb1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uhq9l7n",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());

  EXPECT_NO_THROW((address = Address(NetType::kRegtest,
                   WitnessVersion::kVersion0, pubkey)));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
}